

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Chipset.cpp
# Opt level: O1

void __thiscall Amiga::Chipset::Chipset(Chipset *this,MemoryMap *map,int input_clock_rate)

{
  DiskController *this_00;
  uint16_t *puVar1;
  pointer puVar2;
  DMADevice<4UL,_4UL> *pDVar3;
  DMADevice<6UL,_2UL> *pDVar4;
  uint uVar5;
  Joystick *this_01;
  Rect visible_area;
  Joystick *local_38;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_00598648
  ;
  (this->cia_divider_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->keyboard_divider_).super_WrappedInt<HalfCycles>.length_ = 0;
  *(undefined8 *)((long)&(this->keyboard_divider_).super_WrappedInt<HalfCycles>.length_ + 2) = 0;
  this->interrupt_requests_ = 0;
  this->interrupt_level_ = 0;
  this->dma_control_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->blitter_).super_DMADevice<4UL,_4UL>.super_DMADeviceBase.chipset_ = this;
  (this->blitter_).super_DMADevice<4UL,_4UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->blitter_).super_DMADevice<4UL,_4UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined8 *)&(this->blitter_).super_DMADevice<4UL,_4UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->blitter_).super_DMADevice<4UL,_4UL>.field_0x1c = 0;
  (this->blitter_).super_DMADevice<4UL,_4UL>.modulos_._M_elems[0] = 0;
  (this->blitter_).super_DMADevice<4UL,_4UL>.modulos_._M_elems[1] = 0;
  pDVar3 = &(this->blitter_).super_DMADevice<4UL,_4UL>;
  (pDVar3->modulos_)._M_elems[2] = 0;
  (pDVar3->modulos_)._M_elems[3] = 0;
  (this->blitter_).super_DMADevice<4UL,_4UL>.byte_pointer_._M_elems[0] = 0;
  (this->blitter_).super_DMADevice<4UL,_4UL>.byte_pointer_._M_elems[1] = 0;
  pDVar3 = &(this->blitter_).super_DMADevice<4UL,_4UL>;
  (pDVar3->byte_pointer_)._M_elems[2] = 0;
  (pDVar3->byte_pointer_)._M_elems[3] = 0;
  *(undefined8 *)&(this->blitter_).super_DMADevice<4UL,_4UL>.field_0x44 = 0;
  (this->blitter_).shifts_[0] = 0;
  (this->blitter_).shifts_[1] = 0;
  (this->blitter_).a_mask_[0] = 0xffff;
  (this->blitter_).a_mask_[1] = 0xffff;
  (this->blitter_).line_mode_ = false;
  (this->blitter_).one_dot_ = false;
  (this->blitter_).line_direction_ = 0;
  (this->blitter_).line_sign_ = 1;
  (this->blitter_).direction_ = 1;
  (this->blitter_).sequencer_.control_ = 0;
  (this->blitter_).sequencer_.index_ = 0;
  (this->blitter_).sequencer_.loop_ = 0;
  (this->blitter_).inclusive_fill_ = false;
  (this->blitter_).exclusive_fill_ = false;
  (this->blitter_).fill_carry_ = false;
  (this->blitter_).minterms_ = '\0';
  (this->blitter_).a32_ = 0;
  (this->blitter_).b32_ = 0;
  (this->blitter_).a_data_ = 0;
  (this->blitter_).b_data_ = 0;
  *(undefined4 *)((long)&(this->blitter_).b_data_ + 1) = 0;
  (this->blitter_).sequencer_.phase_ = Complete;
  (this->blitter_).sequencer_.next_phase_ = Complete;
  (this->blitter_).write_address_ = 0xffffffff;
  (this->blitter_).write_value_ = 0;
  (this->blitter_).busy_ = false;
  (this->blitter_).loop_index_ = -1;
  (this->blitter_).error_ = 0;
  (this->blitter_).draw_ = false;
  (this->blitter_).has_c_data_ = false;
  (this->blitter_).transactions_.
  super__Vector_base<Amiga::Blitter<false>::Transaction,_std::allocator<Amiga::Blitter<false>::Transaction>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->blitter_).transactions_.
  super__Vector_base<Amiga::Blitter<false>::Transaction,_std::allocator<Amiga::Blitter<false>::Transaction>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->blitter_).transactions_.
  super__Vector_base<Amiga::Blitter<false>::Transaction,_std::allocator<Amiga::Blitter<false>::Transaction>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[0].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[0].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[0].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[0].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[0].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[0].attached = false;
  (this->sprites_)._M_elems[0].visible = false;
  (this->sprites_)._M_elems[0].h_start = 0;
  (this->sprites_)._M_elems[0].v_start_ = 0;
  (this->sprites_)._M_elems[0].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[1].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[1].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[1].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[1].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[1].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[1].attached = false;
  (this->sprites_)._M_elems[1].visible = false;
  (this->sprites_)._M_elems[1].h_start = 0;
  (this->sprites_)._M_elems[1].v_start_ = 0;
  (this->sprites_)._M_elems[1].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[2].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[2].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[2].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[2].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[2].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[2].attached = false;
  (this->sprites_)._M_elems[2].visible = false;
  (this->sprites_)._M_elems[2].h_start = 0;
  (this->sprites_)._M_elems[2].v_start_ = 0;
  (this->sprites_)._M_elems[2].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[3].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[3].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[3].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[3].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[3].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[3].attached = false;
  (this->sprites_)._M_elems[3].visible = false;
  (this->sprites_)._M_elems[3].h_start = 0;
  (this->sprites_)._M_elems[3].v_start_ = 0;
  (this->sprites_)._M_elems[3].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[4].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[4].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[4].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[4].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[4].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[4].attached = false;
  (this->sprites_)._M_elems[4].visible = false;
  (this->sprites_)._M_elems[4].h_start = 0;
  (this->sprites_)._M_elems[4].v_start_ = 0;
  (this->sprites_)._M_elems[4].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[5].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[5].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[5].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[5].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[5].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[5].attached = false;
  (this->sprites_)._M_elems[5].visible = false;
  (this->sprites_)._M_elems[5].h_start = 0;
  (this->sprites_)._M_elems[5].v_start_ = 0;
  (this->sprites_)._M_elems[5].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[6].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[6].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[6].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[6].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[6].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[6].attached = false;
  (this->sprites_)._M_elems[6].visible = false;
  (this->sprites_)._M_elems[6].h_start = 0;
  (this->sprites_)._M_elems[6].v_start_ = 0;
  (this->sprites_)._M_elems[6].v_stop_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->sprites_)._M_elems[7].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->sprites_)._M_elems[7].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->sprites_)._M_elems[7].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)
   &(this->sprites_)._M_elems[7].super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->sprites_)._M_elems[7].super_DMADevice<1UL,_0UL>.byte_pointer_ = 0;
  (this->sprites_)._M_elems[7].attached = false;
  (this->sprites_)._M_elems[7].visible = false;
  (this->sprites_)._M_elems[7].h_start = 0;
  (this->sprites_)._M_elems[7].v_start_ = 0;
  (this->sprites_)._M_elems[7].v_stop_ = 0;
  this->collisions_ = 0;
  this->collisions_flags_ = 0;
  this->playfield_collision_mask_ = 0;
  this->playfield_collision_complement_ = 0;
  this->line_length_ = 0xe3;
  this->short_field_height_ = 0x138;
  this->vertical_blank_height_ = 0x19;
  this->horizontal_offset_ = 0;
  this->horizontal_fetch_ = Stopped;
  this->line_cycle_ = 0;
  this->y_ = 0;
  this->display_window_start_[0] = 0;
  this->display_window_start_[1] = 0;
  this->display_window_stop_[0] = 0;
  this->display_window_stop_[1] = 0;
  *(undefined8 *)((long)this->display_window_stop_ + 3) = 0;
  this->border_colour_ = 0;
  this->is_border_ = true;
  this->zone_duration_ = 0;
  this->pixels_ = (uint16_t *)0x0;
  this->last_colour_ = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->bitplanes_).super_DMADevice<6UL,_2UL>.super_DMADeviceBase.chipset_ = this;
  (this->bitplanes_).super_DMADevice<6UL,_2UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->bitplanes_).super_DMADevice<6UL,_2UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  (this->bitplanes_).plane_count_ = 0;
  *(undefined8 *)&(this->bitplanes_).super_DMADevice<6UL,_2UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)&(this->bitplanes_).super_DMADevice<6UL,_2UL>.field_0x1c = 0;
  *(undefined8 *)&(this->bitplanes_).super_DMADevice<6UL,_2UL>.field_0x24 = 0;
  *(undefined8 *)(this->bitplanes_).super_DMADevice<6UL,_2UL>.modulos_._M_elems = 0;
  (this->bitplanes_).super_DMADevice<6UL,_2UL>.byte_pointer_._M_elems[0] = 0;
  (this->bitplanes_).super_DMADevice<6UL,_2UL>.byte_pointer_._M_elems[1] = 0;
  pDVar4 = &(this->bitplanes_).super_DMADevice<6UL,_2UL>;
  (pDVar4->byte_pointer_)._M_elems[2] = 0;
  (pDVar4->byte_pointer_)._M_elems[3] = 0;
  *(undefined8 *)((long)(this->bitplanes_).super_DMADevice<6UL,_2UL>.byte_pointer_._M_elems + 9) = 0
  ;
  *(undefined8 *)((long)(this->bitplanes_).super_DMADevice<6UL,_2UL>.byte_pointer_._M_elems + 0x11)
       = 0;
  this->has_next_bitplanes_ = false;
  this->odd_priority_ = 0;
  this->even_priority_ = 0;
  *(undefined8 *)((long)&this->even_priority_ + 1) = 0;
  (this->bitplane_pixels_).data_._M_elems[0] = 0;
  (this->bitplane_pixels_).data_._M_elems[1] = 0;
  *(undefined8 *)((long)(this->bitplane_pixels_).data_._M_elems + 9) = 0;
  *(undefined8 *)((long)&this->odd_delay_ + 1) = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->copper_).super_DMADevice<2UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->copper_).super_DMADevice<2UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->copper_).super_DMADevice<2UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined8 *)&(this->copper_).super_DMADevice<2UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  *(undefined8 *)(this->copper_).super_DMADevice<2UL,_0UL>.byte_pointer_._M_elems = 0;
  (this->copper_).address_ = 0;
  (this->copper_).control_ = 0;
  (this->copper_).state_ = Stopped;
  (this->copper_).skip_next_ = false;
  (this->copper_).instruction_[0] = 0;
  (this->copper_).instruction_[1] = 0;
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  Audio::Audio(&this->audio_,this,puVar1,
               (ulong)((long)(map->chip_ram).
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) >> 1,
               (float)input_clock_rate * 0.5);
  Outputs::CRT::CRT::CRT(&this->crt_,0x38c,4,PAL50,Red4Green4Blue4);
  this->palette_[0x18] = 0;
  this->palette_[0x19] = 0;
  this->palette_[0x1a] = 0;
  this->palette_[0x1b] = 0;
  this->palette_[0x1c] = 0;
  this->palette_[0x1d] = 0;
  this->palette_[0x1e] = 0;
  this->palette_[0x1f] = 0;
  this->palette_[0x10] = 0;
  this->palette_[0x11] = 0;
  this->palette_[0x12] = 0;
  this->palette_[0x13] = 0;
  this->palette_[0x14] = 0;
  this->palette_[0x15] = 0;
  this->palette_[0x16] = 0;
  this->palette_[0x17] = 0;
  this->palette_[8] = 0;
  this->palette_[9] = 0;
  this->palette_[10] = 0;
  this->palette_[0xb] = 0;
  this->palette_[0xc] = 0;
  this->palette_[0xd] = 0;
  this->palette_[0xe] = 0;
  this->palette_[0xf] = 0;
  this->palette_[0] = 0;
  this->palette_[1] = 0;
  this->palette_[2] = 0;
  this->palette_[3] = 0;
  this->palette_[4] = 0;
  this->palette_[5] = 0;
  this->palette_[6] = 0;
  this->palette_[7] = 0;
  this->swizzled_palette_[0] = 0;
  this->swizzled_palette_[1] = 0;
  this->swizzled_palette_[2] = 0;
  this->swizzled_palette_[3] = 0;
  this->swizzled_palette_[4] = 0;
  this->swizzled_palette_[5] = 0;
  this->swizzled_palette_[6] = 0;
  this->swizzled_palette_[7] = 0;
  this->swizzled_palette_[8] = 0;
  this->swizzled_palette_[9] = 0;
  this->swizzled_palette_[10] = 0;
  this->swizzled_palette_[0xb] = 0;
  this->swizzled_palette_[0xc] = 0;
  this->swizzled_palette_[0xd] = 0;
  this->swizzled_palette_[0xe] = 0;
  this->swizzled_palette_[0xf] = 0;
  this->swizzled_palette_[0x10] = 0;
  this->swizzled_palette_[0x11] = 0;
  this->swizzled_palette_[0x12] = 0;
  this->swizzled_palette_[0x13] = 0;
  this->swizzled_palette_[0x14] = 0;
  this->swizzled_palette_[0x15] = 0;
  this->swizzled_palette_[0x16] = 0;
  this->swizzled_palette_[0x17] = 0;
  this->swizzled_palette_[0x18] = 0;
  this->swizzled_palette_[0x19] = 0;
  this->swizzled_palette_[0x1a] = 0;
  this->swizzled_palette_[0x1b] = 0;
  this->swizzled_palette_[0x1c] = 0;
  this->swizzled_palette_[0x1d] = 0;
  this->swizzled_palette_[0x1e] = 0;
  this->swizzled_palette_[0x1f] = 0;
  this->swizzled_palette_[0x20] = 0;
  this->swizzled_palette_[0x21] = 0;
  this->swizzled_palette_[0x22] = 0;
  this->swizzled_palette_[0x23] = 0;
  this->swizzled_palette_[0x24] = 0;
  this->swizzled_palette_[0x25] = 0;
  this->swizzled_palette_[0x26] = 0;
  this->swizzled_palette_[0x27] = 0;
  this->swizzled_palette_[0x28] = 0;
  this->swizzled_palette_[0x29] = 0;
  this->swizzled_palette_[0x2a] = 0;
  this->swizzled_palette_[0x2b] = 0;
  this->swizzled_palette_[0x2c] = 0;
  this->swizzled_palette_[0x2d] = 0;
  this->swizzled_palette_[0x2e] = 0;
  this->swizzled_palette_[0x2f] = 0;
  this->swizzled_palette_[0x30] = 0;
  this->swizzled_palette_[0x31] = 0;
  this->swizzled_palette_[0x32] = 0;
  this->swizzled_palette_[0x33] = 0;
  this->swizzled_palette_[0x34] = 0;
  this->swizzled_palette_[0x35] = 0;
  this->swizzled_palette_[0x36] = 0;
  this->swizzled_palette_[0x37] = 0;
  this->swizzled_palette_[0x38] = 0;
  this->swizzled_palette_[0x39] = 0;
  this->swizzled_palette_[0x3a] = 0;
  this->swizzled_palette_[0x3b] = 0;
  this->swizzled_palette_[0x3c] = 0;
  this->swizzled_palette_[0x3d] = 0;
  this->swizzled_palette_[0x3e] = 0;
  this->swizzled_palette_[0x3f] = 0;
  (this->mouse_).super_Mouse._vptr_Mouse = (_func_int **)&PTR_move_00598870;
  (this->mouse_).super_MouseJoystickInput._vptr_MouseJoystickInput =
       (_func_int **)&PTR_get_position_005988b0;
  (this->mouse_).declared_position_[0] = '\0';
  (this->mouse_).declared_position_[1] = '\0';
  (this->mouse_).cia_state_ = 0xff;
  *(undefined8 *)(this->mouse_).position_._M_elems = 0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->joysticks_).
  super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &this->disk_controller_;
  (this->cia_a_handler_).map_ = map;
  (this->cia_a_handler_).controller_ = this_00;
  (this->cia_a_handler_).mouse_ = &this->mouse_;
  (this->cia_a_handler_).joystick_ = (Joystick *)0x0;
  (this->cia_a_handler_).observer_ = (Observer *)0x0;
  (this->cia_b_handler_).controller_ = this_00;
  MOS::MOS6526::MOS6526<Amiga::Chipset::CIAAHandler,_(MOS::MOS6526::Personality)1>::MOS6526
            (&this->cia_a,&this->cia_a_handler_);
  MOS::MOS6526::MOS6526<Amiga::Chipset::CIABHandler,_(MOS::MOS6526::Personality)1>::MOS6526
            (&this->cia_b,&this->cia_b_handler_);
  puVar1 = (uint16_t *)
           (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar2 = (map->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  (this->disk_).super_DMADevice<1UL,_0UL>.super_DMADeviceBase.chipset_ = this;
  (this->disk_).super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_ = puVar1;
  (this->disk_).super_DMADevice<1UL,_0UL>.super_DMADeviceBase.ram_mask_ =
       (int)((ulong)((long)puVar2 - (long)puVar1) >> 1) - 1;
  *(undefined4 *)&(this->disk_).super_DMADevice<1UL,_0UL>.super_DMADeviceBase.field_0x14 = 0;
  (this->disk_).super_DMADevice<1UL,_0UL>.byte_pointer_._M_elems[0] = 0;
  (this->disk_).dma_enable_ = false;
  (this->disk_).write_ = false;
  (this->disk_).last_set_length_ = 0;
  (this->disk_).sync_with_word_ = false;
  (this->disk_).buffer_read_ = 0;
  (this->disk_).buffer_write_ = 0;
  (this->disk_).state_ = Inactive;
  DiskController::DiskController
            (this_00,(Cycles)(long)input_clock_rate,this,&this->disk_,&this->cia_b);
  this->disk_controller_is_sleeping_ = false;
  this->paula_disk_control_ = 0;
  Amiga::Keyboard::Keyboard(&this->keyboard_,&(this->cia_a).serial_input);
  (this->disk_controller_).super_Controller.super_Source.observer_ = &this->super_Observer;
  uVar5 = (**(this->disk_controller_).super_Controller.super_Source._vptr_Source)(this_00);
  (**(this->super_Observer)._vptr_Observer)(this,this_00,(ulong)uVar5);
  this_01 = (Joystick *)operator_new(0x58);
  Amiga::Joystick::Joystick(this_01);
  local_38 = this_01;
  std::
  vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
  ::emplace_back<Amiga::Joystick*>
            ((vector<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>,std::allocator<std::unique_ptr<Inputs::Joystick,std::default_delete<Inputs::Joystick>>>>
              *)&this->joysticks_,&local_38);
  (this->cia_a_handler_).joystick_ =
       (Joystick *)
       (((this->joysticks_).
         super__Vector_base<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>,_std::allocator<std::unique_ptr<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start)->_M_t).
       super___uniq_ptr_impl<Inputs::Joystick,_std::default_delete<Inputs::Joystick>_>;
  visible_area.size.width = 0.88;
  visible_area.size.height = 0.88;
  visible_area.origin.x = 0.05;
  visible_area.origin.y = 0.055;
  Outputs::CRT::CRT::set_visible_area(&this->crt_,visible_area);
  return;
}

Assistant:

Chipset::Chipset(MemoryMap &map, int input_clock_rate) :
	blitter_(DMA_CONSTRUCT),
	sprites_{
		Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},
		Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT},	Sprite{DMA_CONSTRUCT}
	},
	bitplanes_(DMA_CONSTRUCT),
	copper_(DMA_CONSTRUCT),
	audio_(DMA_CONSTRUCT, float(input_clock_rate / 2.0)),
	crt_(908, 4, Outputs::Display::Type::PAL50, Outputs::Display::InputDataType::Red4Green4Blue4),
	cia_a_handler_(map, disk_controller_, mouse_),
	cia_b_handler_(disk_controller_),
	cia_a(cia_a_handler_),
	cia_b(cia_b_handler_),
	disk_(DMA_CONSTRUCT),
	disk_controller_(Cycles(input_clock_rate), *this, disk_, cia_b),
	keyboard_(cia_a.serial_input) {
	disk_controller_.set_clocking_hint_observer(this);

	joysticks_.emplace_back(new Joystick());
	cia_a_handler_.set_joystick(&joystick(0));

	// Very conservatively crop, to roughly the centre 88% of a frame.
	// This rectange was specifically calibrated around the default Workbench display.
	crt_.set_visible_area(Outputs::Display::Rect(0.05f, 0.055f, 0.88f, 0.88f));
}